

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderStructValue
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  size_type *psVar1;
  _func_int **pp_Var2;
  int *piVar3;
  uint *puVar4;
  float *pfVar5;
  long *plVar6;
  unsigned_long *puVar7;
  stringpiece_ssize_type sVar8;
  double *pdVar9;
  AlphaNum *a;
  AlphaNum *a_00;
  protobuf *ppVar10;
  StringPiece name;
  undefined1 local_160 [32];
  bool local_140;
  size_type *local_130;
  string struct_field_name;
  StringPiece local_100;
  StringPiece local_f0;
  StringPiece local_e0;
  StringPiece local_d0;
  StringPiece local_c0;
  StringPiece local_b0;
  string local_a0;
  DataPiece local_80;
  undefined1 local_58 [8];
  StatusOr<int> int_value;
  
  local_130 = &struct_field_name._M_string_length;
  struct_field_name._M_dataplus._M_p = (pointer)0x0;
  struct_field_name._M_string_length._0_1_ = 0;
  switch(data->type_) {
  case TYPE_INT32:
    if ((ow->options_).struct_integers_as_strings == true) {
      DataPiece::ToInt32((StatusOr<int> *)local_58,data);
      if (local_58._0_4_ == OK) {
        ppVar10 = (protobuf *)0x36a035;
        StringPiece::StringPiece
                  ((StringPiece *)((long)&struct_field_name.field_2 + 8),"string_value");
        piVar3 = StatusOr<int>::value((StatusOr<int> *)local_58);
        SimpleDtoa_abi_cxx11_((string *)&local_80,ppVar10,(double)*piVar3);
        pp_Var2 = local_80._vptr_DataPiece;
        local_160._24_8_ =
             StringPiece::CheckedSsizeTFromSizeT(CONCAT44(local_80._12_4_,local_80.type_));
        local_160._0_8_ = &PTR__DataPiece_003e3c20;
        local_160._8_4_ = TYPE_STRING;
        local_160._16_8_ = pp_Var2;
        local_140 = true;
        ProtoWriter::RenderDataPiece
                  (&ow->super_ProtoWriter,stack0xfffffffffffffef0,(DataPiece *)local_160);
        std::__cxx11::string::~string((string *)&local_80);
        Status::Status(__return_storage_ptr__);
LAB_0033982a:
        std::__cxx11::string::~string((string *)&int_value);
        goto LAB_00339758;
      }
LAB_0033970b:
      std::__cxx11::string::~string((string *)&int_value);
    }
    break;
  case TYPE_INT64:
    if ((ow->options_).struct_integers_as_strings == true) {
      DataPiece::ToInt64((StatusOr<long> *)local_58,data);
      if (local_58._0_4_ == OK) {
        StringPiece::StringPiece(&local_f0,"string_value");
        plVar6 = StatusOr<long>::value((StatusOr<long> *)local_58);
        strings::AlphaNum::AlphaNum((AlphaNum *)local_160,*plVar6);
        StrCat_abi_cxx11_(&local_a0,(protobuf *)local_160,a);
        local_80.field_2.str_.size_ = StringPiece::CheckedSsizeTFromSizeT(local_a0._M_string_length)
        ;
        local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
        local_80.type_ = TYPE_STRING;
        local_80.field_2.i64_ = (int64)local_a0._M_dataplus._M_p;
        local_80.use_strict_base64_decoding_ = true;
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,local_f0,&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        Status::Status(__return_storage_ptr__);
        goto LAB_0033982a;
      }
      goto LAB_0033970b;
    }
    break;
  case TYPE_UINT32:
    if ((ow->options_).struct_integers_as_strings == true) {
      DataPiece::ToUint32((StatusOr<unsigned_int> *)local_58,data);
      if (local_58._0_4_ == OK) {
        ppVar10 = (protobuf *)0x36a035;
        StringPiece::StringPiece(&local_100,"string_value");
        puVar4 = StatusOr<unsigned_int>::value((StatusOr<unsigned_int> *)local_58);
        SimpleDtoa_abi_cxx11_((string *)&local_80,ppVar10,(double)*puVar4);
        pp_Var2 = local_80._vptr_DataPiece;
        local_160._24_8_ =
             StringPiece::CheckedSsizeTFromSizeT(CONCAT44(local_80._12_4_,local_80.type_));
        local_160._0_8_ = &PTR__DataPiece_003e3c20;
        local_160._8_4_ = TYPE_STRING;
        local_160._16_8_ = pp_Var2;
        local_140 = true;
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,local_100,(DataPiece *)local_160);
        std::__cxx11::string::~string((string *)&local_80);
        Status::Status(__return_storage_ptr__);
        goto LAB_0033982a;
      }
      goto LAB_0033970b;
    }
    break;
  case TYPE_UINT64:
    if ((ow->options_).struct_integers_as_strings == true) {
      DataPiece::ToUint64((StatusOr<unsigned_long> *)local_58,data);
      if (local_58._0_4_ == OK) {
        StringPiece::StringPiece(&local_e0,"string_value");
        puVar7 = StatusOr<unsigned_long>::value((StatusOr<unsigned_long> *)local_58);
        strings::AlphaNum::AlphaNum((AlphaNum *)local_160,*puVar7);
        StrCat_abi_cxx11_(&local_a0,(protobuf *)local_160,a_00);
        local_80.field_2.str_.size_ = StringPiece::CheckedSsizeTFromSizeT(local_a0._M_string_length)
        ;
        local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
        local_80.type_ = TYPE_STRING;
        local_80.field_2.i64_ = (int64)local_a0._M_dataplus._M_p;
        local_80.use_strict_base64_decoding_ = true;
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,local_e0,&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        Status::Status(__return_storage_ptr__);
        goto LAB_0033982a;
      }
      goto LAB_0033970b;
    }
    break;
  case TYPE_DOUBLE:
    if ((ow->options_).struct_integers_as_strings == true) {
      DataPiece::ToDouble((StatusOr<double> *)local_58,data);
      if (local_58._0_4_ == OK) {
        ppVar10 = (protobuf *)0x36a035;
        StringPiece::StringPiece(&local_c0,"string_value");
        pdVar9 = StatusOr<double>::value((StatusOr<double> *)local_58);
        SimpleDtoa_abi_cxx11_((string *)&local_80,ppVar10,*pdVar9);
        pp_Var2 = local_80._vptr_DataPiece;
        local_160._24_8_ =
             StringPiece::CheckedSsizeTFromSizeT(CONCAT44(local_80._12_4_,local_80.type_));
        local_160._0_8_ = &PTR__DataPiece_003e3c20;
        local_160._8_4_ = TYPE_STRING;
        local_160._16_8_ = pp_Var2;
        local_140 = true;
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,local_c0,(DataPiece *)local_160);
        std::__cxx11::string::~string((string *)&local_80);
        Status::Status(__return_storage_ptr__);
        goto LAB_0033982a;
      }
      goto LAB_0033970b;
    }
    break;
  case TYPE_FLOAT:
    if ((ow->options_).struct_integers_as_strings == true) {
      DataPiece::ToFloat((StatusOr<float> *)local_58,data);
      if (local_58._0_4_ == OK) {
        ppVar10 = (protobuf *)0x36a035;
        StringPiece::StringPiece(&local_d0,"string_value");
        pfVar5 = StatusOr<float>::value((StatusOr<float> *)local_58);
        SimpleDtoa_abi_cxx11_((string *)&local_80,ppVar10,(double)*pfVar5);
        pp_Var2 = local_80._vptr_DataPiece;
        local_160._24_8_ =
             StringPiece::CheckedSsizeTFromSizeT(CONCAT44(local_80._12_4_,local_80.type_));
        local_160._0_8_ = &PTR__DataPiece_003e3c20;
        local_160._8_4_ = TYPE_STRING;
        local_160._16_8_ = pp_Var2;
        local_140 = true;
        ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,local_d0,(DataPiece *)local_160);
        std::__cxx11::string::~string((string *)&local_80);
        Status::Status(__return_storage_ptr__);
        goto LAB_0033982a;
      }
      goto LAB_0033970b;
    }
    break;
  case TYPE_BOOL:
    break;
  default:
    StringPiece::StringPiece
              (&local_b0,
               "Invalid struct data type. Only number, string, boolean or null values are supported."
              );
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,local_b0);
    goto LAB_00339758;
  case TYPE_STRING:
    break;
  case TYPE_NULL:
  }
  std::__cxx11::string::assign((char *)&local_130);
  psVar1 = local_130;
  sVar8 = StringPiece::CheckedSsizeTFromSizeT((size_t)struct_field_name._M_dataplus._M_p);
  name.length_ = sVar8;
  name.ptr_ = (char *)psVar1;
  ProtoWriter::RenderDataPiece(&ow->super_ProtoWriter,name,data);
  Status::Status(__return_storage_ptr__);
LAB_00339758:
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderStructValue(ProtoStreamObjectWriter* ow,
                                                  const DataPiece& data) {
  std::string struct_field_name;
  switch (data.type()) {
    case DataPiece::TYPE_INT32: {
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<int32> int_value = data.ToInt32();
        if (int_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value",
              DataPiece(SimpleDtoa(int_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_UINT32: {
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<uint32> int_value = data.ToUint32();
        if (int_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value",
              DataPiece(SimpleDtoa(int_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_INT64: {
      // If the option to treat integers as strings is set, then render them as
      // strings. Otherwise, fallback to rendering them as double.
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<int64> int_value = data.ToInt64();
        if (int_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value", DataPiece(StrCat(int_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_UINT64: {
      // If the option to treat integers as strings is set, then render them as
      // strings. Otherwise, fallback to rendering them as double.
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<uint64> int_value = data.ToUint64();
        if (int_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value", DataPiece(StrCat(int_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_FLOAT: {
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<float> float_value = data.ToFloat();
        if (float_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value",
              DataPiece(SimpleDtoa(float_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_DOUBLE: {
      if (ow->options_.struct_integers_as_strings) {
        StatusOr<double> double_value = data.ToDouble();
        if (double_value.ok()) {
          ow->ProtoWriter::RenderDataPiece(
              "string_value",
              DataPiece(SimpleDtoa(double_value.value()), true));
          return Status();
        }
      }
      struct_field_name = "number_value";
      break;
    }
    case DataPiece::TYPE_STRING: {
      struct_field_name = "string_value";
      break;
    }
    case DataPiece::TYPE_BOOL: {
      struct_field_name = "bool_value";
      break;
    }
    case DataPiece::TYPE_NULL: {
      struct_field_name = "null_value";
      break;
    }
    default: {
      return Status(util::error::INVALID_ARGUMENT,
                    "Invalid struct data type. Only number, string, boolean or "
                    "null values are supported.");
    }
  }
  ow->ProtoWriter::RenderDataPiece(struct_field_name, data);
  return Status();
}